

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nxx.cpp
# Opt level: O3

bool mg::data::nxgx_compress(string_view *in,string *out)

{
  pointer pcVar1;
  undefined8 uVar2;
  int iVar3;
  uint uVar4;
  char *__format;
  char *local_98;
  ulong local_90;
  undefined8 uStack_88;
  pointer local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  
  local_40 = 0;
  uStack_38 = 0;
  local_50 = 0;
  uStack_48 = 0;
  local_60 = 0;
  uStack_58 = 0;
  local_70 = 0;
  uStack_68 = 0;
  local_80 = (pointer)0x0;
  uStack_78 = 0;
  uStack_88 = 0;
  local_30 = 0;
  local_90 = in->_M_len & 0xffffffff;
  local_98 = in->_M_str;
  std::__cxx11::string::resize((ulong)out,(char)in->_M_len + '\x10');
  uStack_78 = CONCAT44(uStack_78._4_4_,(int)out->_M_string_length);
  local_80 = (out->_M_dataplus)._M_p + 0x10;
  local_70 = 0;
  iVar3 = deflateInit2_(&local_98,0xffffffff,8,0x1f,8,0,"1.2.11",0x70);
  if (iVar3 == 0) {
    uVar4 = deflate((data *)&local_98,4);
    uVar2 = local_70;
    if (uVar4 < 2) {
      uVar4 = deflateEnd();
      if (uVar4 < 2) {
        pcVar1 = (out->_M_dataplus)._M_p;
        *(int *)(pcVar1 + 4) = (int)in->_M_len;
        *(int *)(pcVar1 + 8) = (int)uVar2;
        pcVar1[0] = 'N';
        pcVar1[1] = 'X';
        pcVar1[2] = 'G';
        pcVar1[3] = 'X';
        std::__cxx11::string::resize((ulong)out,(char)uVar2 + '\x10');
        return true;
      }
      __format = "zlib deflateEnd error: %d: %s\n";
    }
    else {
      __format = "zlib deflate error: %d: %s\n";
    }
    fprintf(_stderr,__format,(ulong)uVar4,uStack_68);
  }
  else {
    nxgx_compress((data *)&local_98);
  }
  return false;
}

Assistant:

bool nxgx_compress(const std::string_view &in, std::string &out) {
  // Create stream context
  z_stream dstream{};
  dstream.avail_in = in.size();
  dstream.next_in =
      const_cast<uint8_t *>(reinterpret_cast<const uint8_t *>(in.data()));

  // Default output to same size as input + size of header
  out.resize(in.size() + sizeof(Nxx));

  // Set the output start to be past the end of the reserved header area
  dstream.avail_out = out.size();
  dstream.next_out = reinterpret_cast<uint8_t *>(out.data() + sizeof(Nxx));
  dstream.total_out = 0;

  // Init deflate context
  if (int err = deflateInit2(&dstream, -1, 8, 15 + 16, 8, 0) != Z_OK) {
    fprintf(stderr, "zlib init error: %d: %s\n", err, dstream.msg);
    return false;
  }

  // Perform deflate
  int err = deflate(&dstream, Z_FINISH);
  if (err != Z_OK && err != Z_STREAM_END) {
    fprintf(stderr, "zlib deflate error: %d: %s\n", err, dstream.msg);
    return false;
  }

  // Get the final compressed size
  const int compressed_size = dstream.total_out;

  err = deflateEnd(&dstream);
  if (err != Z_OK && err != Z_STREAM_END) {
    fprintf(stderr, "zlib deflateEnd error: %d: %s\n", err, dstream.msg);
    return false;
  }

  // Write the header
  Nxx *header = reinterpret_cast<Nxx *>(out.data());
  header->size = in.size();
  header->compressed_size = compressed_size;
  memcpy(header->magic, MAGIC_NXGX, sizeof(header->magic));
  header->to_file_order();

  // Shrunk output buffer to wrap
  out.resize(sizeof(Nxx) + compressed_size);

  return true;
}